

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.cpp
# Opt level: O3

void __thiscall DrawerCommandQueue::Finish(DrawerCommandQueue *this)

{
  pointer ppDVar1;
  pointer ppDVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  DrawerCommand **command;
  pointer ppDVar9;
  int iVar10;
  unique_lock<std::mutex> end_lock;
  unique_lock<std::mutex> start_lock;
  unique_lock<std::mutex> uStack_1cdb0;
  unique_lock<std::mutex> uStack_1cda0;
  long lStack_1cd90;
  undefined4 uStack_1cd88;
  int iStack_1cd84;
  undefined8 uStack_1cd80;
  undefined1 auStack_1cd78 [14400];
  undefined1 *puStack_19538;
  undefined1 auStack_19530 [57600];
  undefined1 *local_b430;
  
  Instance();
  if (Instance::queue.commands.super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      Instance::queue.commands.super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uStack_1cda0._M_device = &Instance::queue.start_mutex;
    uStack_1cda0._M_owns = false;
    std::unique_lock<std::mutex>::lock(&uStack_1cda0);
    ppDVar2 = Instance::queue.active_commands.
              super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    ppDVar9 = Instance::queue.active_commands.
              super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppDVar1 = Instance::queue.active_commands.
              super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uStack_1cda0._M_owns = true;
    Instance::queue.active_commands.
    super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         Instance::queue.commands.
         super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    Instance::queue.active_commands.
    super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         Instance::queue.commands.
         super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    Instance::queue.active_commands.
    super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         Instance::queue.commands.
         super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    Instance::queue.commands.super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>.
    _M_impl.super__Vector_impl_data._M_start = ppDVar1;
    Instance::queue.commands.super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppDVar9;
    Instance::queue.commands.super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = ppDVar2;
    Instance::queue.run_id = Instance::queue.run_id + 1;
    std::unique_lock<std::mutex>::unlock(&uStack_1cda0);
    StartThreads(&Instance::queue);
    std::condition_variable::notify_all();
    puStack_19538 = auStack_1cd78;
    lStack_1cd90 = 0;
    uStack_1cd80 = 0xe1000000000;
    local_b430 = auStack_19530;
    uStack_1cd88 = 0;
    iStack_1cd84 = (int)((ulong)((long)Instance::queue.threads.
                                       super__Vector_base<DrawerThread,_std::allocator<DrawerThread>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)Instance::queue.threads.
                                      super__Vector_base<DrawerThread,_std::allocator<DrawerThread>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x13bf9225
                   + 1;
    if (0 < Instance::queue.num_passes) {
      iVar10 = 0;
      iVar3 = Instance::queue.num_passes;
      do {
        iVar5 = Instance::queue.rows_in_pass * iVar10;
        iVar10 = iVar10 + 1;
        iVar4 = Instance::queue.rows_in_pass * iVar10;
        iVar6 = 0xe10;
        if (0xe10 < iVar4) {
          iVar6 = iVar4;
        }
        if (iVar10 != iVar3) {
          iVar6 = iVar4;
        }
        uStack_1cd80 = CONCAT44(iVar6,iVar5);
        if ((long)Instance::queue.active_commands.
                  super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)Instance::queue.active_commands.
                  super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          lVar7 = (long)Instance::queue.active_commands.
                        super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)Instance::queue.active_commands.
                        super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3;
          lVar8 = 0;
          do {
            (*Instance::queue.active_commands.
              super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8]->_vptr_DrawerCommand[2])
                      (Instance::queue.active_commands.
                       super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl
                       .super__Vector_impl_data._M_start[lVar8],&lStack_1cd90);
            lVar8 = lVar8 + 1;
            iVar3 = Instance::queue.num_passes;
          } while (lVar7 + (ulong)(lVar7 == 0) != lVar8);
        }
      } while (iVar10 < iVar3);
    }
    uStack_1cdb0._M_device = &Instance::queue.end_mutex;
    uStack_1cdb0._M_owns = false;
    std::unique_lock<std::mutex>::lock(&uStack_1cdb0);
    uStack_1cdb0._M_owns = true;
    if (Instance::queue.finished_threads !=
        ((long)Instance::queue.threads.
               super__Vector_base<DrawerThread,_std::allocator<DrawerThread>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)Instance::queue.threads.
               super__Vector_base<DrawerThread,_std::allocator<DrawerThread>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) * 0x22a8c56113bf9225) {
      do {
        std::condition_variable::wait((unique_lock *)&Instance::queue.end_condition);
      } while (Instance::queue.finished_threads !=
               ((long)Instance::queue.threads.
                      super__Vector_base<DrawerThread,_std::allocator<DrawerThread>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)Instance::queue.threads.
                      super__Vector_base<DrawerThread,_std::allocator<DrawerThread>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * 0x22a8c56113bf9225);
    }
    if (*(int *)(Instance::queue.thread_error.Chars + -0xc) != 0) {
      if (Instance::queue.thread_error_fatal == true) {
        I_FatalError("%s");
      }
      else if (Finish()::first == '\0') {
        Printf("%s\n");
      }
      Finish()::first = '\x01';
    }
    ppDVar1 = Instance::queue.active_commands.
              super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppDVar9 = Instance::queue.active_commands.
              super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (Instance::queue.active_commands.
        super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        Instance::queue.active_commands.
        super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        (**(*ppDVar9)->_vptr_DrawerCommand)();
        ppDVar9 = ppDVar9 + 1;
      } while (ppDVar9 != ppDVar1);
      if (Instance::queue.active_commands.
          super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          Instance::queue.active_commands.
          super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        Instance::queue.active_commands.
        super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             Instance::queue.active_commands.
             super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
    }
    Instance::queue.memorypool_pos = 0;
    Instance::queue.finished_threads = 0;
    std::unique_lock<std::mutex>::~unique_lock(&uStack_1cdb0);
    if (lStack_1cd90 != 0) {
      std::terminate();
    }
    std::unique_lock<std::mutex>::~unique_lock(&uStack_1cda0);
  }
  return;
}

Assistant:

void DrawerCommandQueue::Finish()
{
	auto queue = Instance();
	if (queue->commands.empty())
		return;

	// Give worker threads something to do:

	std::unique_lock<std::mutex> start_lock(queue->start_mutex);
	queue->active_commands.swap(queue->commands);
	queue->run_id++;
	start_lock.unlock();

	queue->StartThreads();
	queue->start_condition.notify_all();

	// Do one thread ourselves:

	DrawerThread thread;
	thread.core = 0;
	thread.num_cores = (int)(queue->threads.size() + 1);

	struct TryCatchData
	{
		DrawerCommandQueue *queue;
		DrawerThread *thread;
		size_t command_index;
	} data;

	data.queue = queue;
	data.thread = &thread;
	data.command_index = 0;
	VectoredTryCatch(&data,
	[](void *data)
	{
		TryCatchData *d = (TryCatchData*)data;

		for (int pass = 0; pass < d->queue->num_passes; pass++)
		{
			d->thread->pass_start_y = pass * d->queue->rows_in_pass;
			d->thread->pass_end_y = (pass + 1) * d->queue->rows_in_pass;
			if (pass + 1 == d->queue->num_passes)
				d->thread->pass_end_y = MAX(d->thread->pass_end_y, MAXHEIGHT);

			size_t size = d->queue->active_commands.size();
			for (d->command_index = 0; d->command_index < size; d->command_index++)
			{
				auto &command = d->queue->active_commands[d->command_index];
				command->Execute(d->thread);
			}
		}
	},
	[](void *data, const char *reason, bool fatal)
	{
		TryCatchData *d = (TryCatchData*)data;
		ReportDrawerError(d->queue->active_commands[d->command_index], true, reason, fatal);
	});

	// Wait for everyone to finish:

	std::unique_lock<std::mutex> end_lock(queue->end_mutex);
	queue->end_condition.wait(end_lock, [&]() { return queue->finished_threads == queue->threads.size(); });

	if (!queue->thread_error.IsEmpty())
	{
		static bool first = true;
		if (queue->thread_error_fatal)
			I_FatalError("%s", queue->thread_error.GetChars());
		else if (first)
			Printf("%s\n", queue->thread_error.GetChars());
		first = false;
	}

	// Clean up batch:

	for (auto &command : queue->active_commands)
		command->~DrawerCommand();
	queue->active_commands.clear();
	queue->memorypool_pos = 0;
	queue->finished_threads = 0;
}